

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<CoolProp::CriticalState,std::allocator<CoolProp::CriticalState>>,CoolProp::CriticalState>
       ::cast<std::vector<CoolProp::CriticalState,std::allocator<CoolProp::CriticalState>>>
                 (vector<CoolProp::CriticalState,_std::allocator<CoolProp::CriticalState>_> *src,
                 return_value_policy policy,handle parent)

{
  itype *piVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  itype *src_00;
  list l;
  object value_;
  
  list::list(&l,*(long *)(src + 8) - *(long *)src >> 6);
  src_00 = *(itype **)src;
  piVar1 = *(itype **)(src + 8);
  lVar3 = 0;
  do {
    hVar2.m_ptr = (PyObject *)l.super_object.super_handle.m_ptr;
    if (src_00 == piVar1) {
      l.super_object.super_handle.m_ptr = (object)(handle)0x0;
      goto LAB_0016760e;
    }
    hVar2 = type_caster_base<CoolProp::CriticalState>::cast(src_00,move,parent);
    value_.super_handle = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if ((*(byte *)(*(long *)((long)l.super_object.super_handle.m_ptr + 8) + 0xab) & 2) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<CoolProp::CriticalState>, CoolProp::CriticalState>::cast(T &&, return_value_policy, handle) [Type = std::vector<CoolProp::CriticalState>, Value = CoolProp::CriticalState, T = std::vector<CoolProp::CriticalState>]"
                     );
      }
      *(PyObject **)(*(long *)((long)l.super_object.super_handle.m_ptr + 0x18) + lVar3 * 8) =
           hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    object::~object(&value_);
    src_00 = (itype *)&src_00->logger_p;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_0016760e:
  object::~object(&l.super_object);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }